

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall choc::value::Type::Object::~Object(Object *this)

{
  Allocator *pAVar1;
  MemberNameAndType *pMVar2;
  ulong uVar3;
  long lVar4;
  AllocatedVector<choc::value::MemberNameAndType> *__range2;
  
  pAVar1 = (this->members).allocator;
  if (pAVar1 == (Allocator *)0x0) {
    free((this->className)._M_str);
  }
  else {
    (**(code **)(*(long *)pAVar1 + 0x20))();
  }
  uVar3 = (ulong)(this->members).size;
  if (uVar3 != 0) {
    pMVar2 = (this->members).items;
    lVar4 = 0;
    do {
      pAVar1 = (this->members).allocator;
      if (pAVar1 == (Allocator *)0x0) {
        free(*(void **)((long)&(pMVar2->name)._M_str + lVar4));
      }
      else {
        (**(code **)(*(long *)pAVar1 + 0x20))();
      }
      lVar4 = lVar4 + 0x30;
    } while (uVar3 * 0x30 != lVar4);
  }
  AllocatedVector<choc::value::MemberNameAndType>::~AllocatedVector(&this->members);
  return;
}

Assistant:

~Object() noexcept
    {
        freeString (members.allocator, className);

        for (auto& m : members)
            freeString (members.allocator, m.name);
    }